

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::DeleteItem
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  bool bVar1;
  BOOL BVar2;
  JavascriptString *this_00;
  char16 *varName;
  uint32 local_44;
  void *local_40;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_44 = index;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_44,
                     (IndexPropertyDescriptor **)&i,(int *)&local_40);
  if (bVar1) {
    if ((_i->Attributes & 8) != 0) {
      return 1;
    }
    if ((_i->Attributes & 2) != 0) {
      JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
      (_i->Getter).ptr = (void *)0x0;
      (_i->Setter).ptr = (void *)0x0;
      _i->Attributes = '\x0e';
      return 1;
    }
  }
  else {
    if ((this->dataItemAttributes & 2) != 0) {
      BVar2 = JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
      return BVar2;
    }
    BVar2 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,&local_40);
    if (BVar2 == 0) {
      return 1;
    }
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = TaggedInt::ToString(index,scriptContext);
  varName = JavascriptString::GetString(this_00);
  JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
            (propertyOperationFlags,scriptContext,varName);
  return 0;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::DeleteItem(ES5Array* arr, DynamicObject* instance, uint32 index, PropertyOperationFlags propertyOperationFlags)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }

            arr->DirectDeleteItemAt<Var>(index);
            descriptor->Getter = nullptr;
            descriptor->Setter = nullptr;
            descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            return true;
        }

        // Not in attribute map
        if (!(GetDataItemAttributes() & PropertyConfigurable))
        {
            if (HasDataItem(arr, index))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }
            return true; // non-existing non-configurable property can be deleted
        }
        return arr->DirectDeleteItemAt<Var>(index);
    }